

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int bio_inalign(opj_bio_t *bio)

{
  int iVar1;
  opj_bio_t *in_RDI;
  
  in_RDI->ct = 0;
  if ((in_RDI->buf & 0xff) == 0xff) {
    iVar1 = bio_bytein(in_RDI);
    if (iVar1 != 0) {
      return 1;
    }
    in_RDI->ct = 0;
  }
  return 0;
}

Assistant:

int bio_inalign(opj_bio_t *bio) {
	bio->ct = 0;
	if ((bio->buf & 0xff) == 0xff) {
		if (bio_bytein(bio)) {
			return 1;
		}
		bio->ct = 0;
	}
	return 0;
}